

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintFastq(ConvertToolPrivate *this,BamAlignment *a)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  string sequence;
  string qualities;
  string name;
  char local_89;
  string local_88;
  string local_68;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  pcVar1 = (a->Name)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (a->Name)._M_string_length);
  bVar2 = BamAlignment::IsPaired(a);
  if (bVar2) {
    BamAlignment::IsFirstMate(a);
    std::__cxx11::string::append((char *)&local_48);
  }
  pcVar1 = (a->Qualities)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (a->Qualities)._M_string_length);
  pcVar1 = (a->QueryBases)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (a->QueryBases)._M_string_length);
  bVar2 = BamAlignment::IsReverseStrand(a);
  if (bVar2) {
    Utilities::Reverse(&local_68);
    Utilities::ReverseComplement(&local_88);
  }
  local_89 = '@';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(&this->m_out,&local_89,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_48,local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  local_89 = '+';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_89,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintFastq(const BamAlignment& a)
{

    // @BamAlignment.Name
    // BamAlignment.QueryBases
    // +
    // BamAlignment.Qualities
    //
    // N.B. - QueryBases are reverse-complemented (& Qualities reversed) if aligned to reverse strand .
    //        Name is appended "/1" or "/2" if paired-end, to reflect which mate this entry is.

    // handle paired-end alignments
    std::string name = a.Name;
    if (a.IsPaired()) name.append((a.IsFirstMate() ? "/1" : "/2"));

    // handle reverse strand alignment - bases & qualities
    std::string qualities = a.Qualities;
    std::string sequence = a.QueryBases;
    if (a.IsReverseStrand()) {
        Utilities::Reverse(qualities);
        Utilities::ReverseComplement(sequence);
    }

    // write to output stream
    m_out << '@' << name << std::endl
          << sequence << std::endl
          << '+' << std::endl
          << qualities << std::endl;
}